

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

char * __thiscall PrimitiveTestClass::FillValues<char*>(PrimitiveTestClass *this)

{
  int iVar1;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  
  iVar1 = this->SIZE;
  pcVar2 = (char *)operator_new__((long)iVar1);
  for (uVar3 = 0; (long)iVar1 != uVar3; uVar3 = uVar3 + 1) {
    pcVar2[uVar3] = -1;
  }
  return pcVar2;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }